

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

size_t nghttp2_hd_deflate_bound(nghttp2_hd_deflater *deflater,nghttp2_nv *nva,size_t nvlen)

{
  ulong local_30;
  size_t i;
  size_t n;
  size_t nvlen_local;
  nghttp2_nv *nva_local;
  nghttp2_hd_deflater *deflater_local;
  
  i = nvlen * 0xc + 0xc;
  for (local_30 = 0; local_30 < nvlen; local_30 = local_30 + 1) {
    i = nva[local_30].namelen + nva[local_30].valuelen + i;
  }
  return i;
}

Assistant:

size_t nghttp2_hd_deflate_bound(nghttp2_hd_deflater *deflater,
                                const nghttp2_nv *nva, size_t nvlen) {
  size_t n = 0;
  size_t i;
  (void)deflater;

  /* Possible Maximum Header Table Size Change.  Encoding (1u << 31) -
     1 using 4 bit prefix requires 6 bytes.  We may emit this at most
     twice. */
  n += 12;

  /* Use Literal Header Field without indexing - New Name, since it is
     most space consuming format.  Also we choose the less one between
     non-huffman and huffman, so using literal byte count is
     sufficient for upper bound.

     Encoding (1u << 31) - 1 using 7 bit prefix requires 6 bytes.  We
     need 2 of this for |nvlen| header fields. */
  n += 6 * 2 * nvlen;

  for (i = 0; i < nvlen; ++i) {
    n += nva[i].namelen + nva[i].valuelen;
  }

  return n;
}